

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O3

int read_mv_component(aom_reader *r,nmv_component *mvcomp,int use_subpel,int usehp)

{
  ushort uVar1;
  ushort uVar2;
  short sVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  byte bVar9;
  aom_cdf_prob (*icdf) [3];
  ulong uVar10;
  aom_cdf_prob (*icdf_00) [5];
  long lVar11;
  od_ec_dec *dec;
  uint uVar12;
  aom_cdf_prob *icdf_01;
  
  dec = &r->ec;
  iVar4 = od_ec_decode_cdf_q15(dec,mvcomp->sign_cdf,2);
  if (r->allow_update_cdf != '\0') {
    uVar1 = mvcomp->sign_cdf[2];
    bVar9 = (char)(uVar1 >> 4) + 4;
    uVar2 = mvcomp->sign_cdf[0];
    if ((char)iVar4 < '\x01') {
      sVar3 = -(uVar2 >> (bVar9 & 0x1f));
    }
    else {
      sVar3 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar9 & 0x1f));
    }
    mvcomp->sign_cdf[0] = sVar3 + uVar2;
    mvcomp->sign_cdf[2] = uVar1 + (uVar1 < 0x20);
  }
  uVar5 = od_ec_decode_cdf_q15(dec,mvcomp->classes_cdf,0xb);
  if (r->allow_update_cdf != '\0') {
    uVar1 = mvcomp->classes_cdf[0xb];
    bVar9 = (char)(uVar1 >> 4) + 5;
    lVar11 = 0;
    do {
      uVar2 = mvcomp->classes_cdf[lVar11];
      if (lVar11 < (char)uVar5) {
        sVar3 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar9 & 0x1f));
      }
      else {
        sVar3 = -(uVar2 >> (bVar9 & 0x1f));
      }
      mvcomp->classes_cdf[lVar11] = sVar3 + uVar2;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 10);
    mvcomp->classes_cdf[0xb] = mvcomp->classes_cdf[0xb] + (ushort)(uVar1 < 0x20);
  }
  if (uVar5 == 0) {
    uVar12 = od_ec_decode_cdf_q15(dec,mvcomp->class0_cdf,2);
    iVar6 = 1;
    if (r->allow_update_cdf != '\0') {
      uVar1 = mvcomp->class0_cdf[2];
      bVar9 = (char)(uVar1 >> 4) + 4;
      uVar2 = mvcomp->class0_cdf[0];
      if ((char)uVar12 < '\x01') {
        sVar3 = -(uVar2 >> (bVar9 & 0x1f));
      }
      else {
        sVar3 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar9 & 0x1f));
      }
      mvcomp->class0_cdf[0] = sVar3 + uVar2;
      mvcomp->class0_cdf[2] = uVar1 + (uVar1 < 0x20);
    }
  }
  else {
    if ((int)uVar5 < 1) {
      uVar12 = 0;
    }
    else {
      icdf = mvcomp->bits_cdf;
      uVar10 = 0;
      uVar12 = 0;
      do {
        iVar6 = od_ec_decode_cdf_q15(dec,*icdf,2);
        if (r->allow_update_cdf != '\0') {
          uVar1 = (*icdf)[2];
          bVar9 = (char)(uVar1 >> 4) + 4;
          uVar2 = (*icdf)[0];
          if ((char)iVar6 < '\x01') {
            sVar3 = -(uVar2 >> (bVar9 & 0x1f));
          }
          else {
            sVar3 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar9 & 0x1f));
          }
          (*icdf)[0] = sVar3 + uVar2;
          (*icdf)[2] = uVar1 + (uVar1 < 0x20);
        }
        uVar12 = uVar12 | iVar6 << ((byte)uVar10 & 0x1f);
        uVar10 = uVar10 + 1;
        icdf = icdf + 1;
      } while (uVar5 != uVar10);
    }
    iVar6 = (2 << ((char)uVar5 + 2U & 0x1f)) + 1;
  }
  if (use_subpel == 0) {
    uVar5 = 6;
    uVar8 = 1;
  }
  else {
    icdf_00 = mvcomp->class0_fp_cdf + (int)uVar12;
    if (uVar5 != 0) {
      icdf_00 = &mvcomp->fp_cdf;
    }
    iVar7 = od_ec_decode_cdf_q15(dec,*icdf_00,4);
    if (r->allow_update_cdf != '\0') {
      uVar1 = (*icdf_00)[4];
      bVar9 = (char)(uVar1 >> 4) + 5;
      lVar11 = 0;
      do {
        uVar2 = (*icdf_00)[lVar11];
        if (lVar11 < (char)iVar7) {
          sVar3 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar9 & 0x1f));
        }
        else {
          sVar3 = -(uVar2 >> (bVar9 & 0x1f));
        }
        (*icdf_00)[lVar11] = sVar3 + uVar2;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      (*icdf_00)[4] = (*icdf_00)[4] + (ushort)(uVar1 < 0x20);
    }
    if (usehp == 0) {
      uVar8 = 1;
    }
    else {
      icdf_01 = mvcomp->class0_hp_cdf;
      if (uVar5 != 0) {
        icdf_01 = mvcomp->hp_cdf;
      }
      uVar8 = od_ec_decode_cdf_q15(dec,icdf_01,2);
      if (r->allow_update_cdf != '\0') {
        uVar1 = icdf_01[2];
        bVar9 = (char)(uVar1 >> 4) + 4;
        uVar2 = *icdf_01;
        if ((char)uVar8 < '\x01') {
          sVar3 = -(uVar2 >> (bVar9 & 0x1f));
        }
        else {
          sVar3 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar9 & 0x1f));
        }
        *icdf_01 = sVar3 + uVar2;
        icdf_01[2] = uVar1 + (uVar1 < 0x20);
      }
    }
    uVar5 = iVar7 * 2;
  }
  iVar6 = iVar6 + (uVar12 << 3 | uVar8 | uVar5);
  iVar7 = -iVar6;
  if (iVar4 == 0) {
    iVar7 = iVar6;
  }
  return iVar7;
}

Assistant:

static int read_mv_component(aom_reader *r, nmv_component *mvcomp,
                             int use_subpel, int usehp) {
  int mag, d, fr, hp;
  const int sign = aom_read_symbol(r, mvcomp->sign_cdf, 2, ACCT_STR);
  const int mv_class =
      aom_read_symbol(r, mvcomp->classes_cdf, MV_CLASSES, ACCT_STR);
  const int class0 = mv_class == MV_CLASS_0;

  // Integer part
  if (class0) {
    d = aom_read_symbol(r, mvcomp->class0_cdf, CLASS0_SIZE, ACCT_STR);
    mag = 0;
  } else {
    const int n = mv_class + CLASS0_BITS - 1;  // number of bits
    d = 0;
    for (int i = 0; i < n; ++i)
      d |= aom_read_symbol(r, mvcomp->bits_cdf[i], 2, ACCT_STR) << i;
    mag = CLASS0_SIZE << (mv_class + 2);
  }

  if (use_subpel) {
    // Fractional part
    fr = aom_read_symbol(r, class0 ? mvcomp->class0_fp_cdf[d] : mvcomp->fp_cdf,
                         MV_FP_SIZE, ACCT_STR);

    // High precision part (if hp is not used, the default value of the hp is 1)
    hp = usehp ? aom_read_symbol(
                     r, class0 ? mvcomp->class0_hp_cdf : mvcomp->hp_cdf, 2,
                     ACCT_STR)
               : 1;
  } else {
    fr = 3;
    hp = 1;
  }

  // Result
  mag += ((d << 3) | (fr << 1) | hp) + 1;
  return sign ? -mag : mag;
}